

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetViewPlane(ON_Viewport *this,double view_plane_depth,ON_Plane *view_plane)

{
  double dVar1;
  byte bVar2;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  bVar2 = this->m_bValidCamera & this->m_bValidFrustum;
  if (bVar2 == 1) {
    ::operator*(&local_60,view_plane_depth,&this->m_CamZ);
    ON_3dPoint::operator-(&local_48,&this->m_CamLoc,&local_60);
    (view_plane->origin).z = local_48.z;
    (view_plane->origin).x = local_48.x;
    (view_plane->origin).y = local_48.y;
    (view_plane->xaxis).z = (this->m_CamX).z;
    dVar1 = (this->m_CamX).y;
    (view_plane->xaxis).x = (this->m_CamX).x;
    (view_plane->xaxis).y = dVar1;
    dVar1 = (this->m_CamY).y;
    (view_plane->yaxis).x = (this->m_CamY).x;
    (view_plane->yaxis).y = dVar1;
    (view_plane->yaxis).z = (this->m_CamY).z;
    dVar1 = (this->m_CamZ).y;
    (view_plane->zaxis).x = (this->m_CamZ).x;
    (view_plane->zaxis).y = dVar1;
    (view_plane->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(view_plane);
  }
  return (bool)bVar2;
}

Assistant:

bool ON_Viewport::GetViewPlane( 
  double view_plane_depth,
  ON_Plane& view_plane 
  ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    view_plane.origin = m_CamLoc - view_plane_depth*m_CamZ;
    view_plane.xaxis = m_CamX;
    view_plane.yaxis = m_CamY;
    view_plane.zaxis = m_CamZ;
    view_plane.UpdateEquation();
  }
  return rc;
}